

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implementation.hpp
# Opt level: O3

void __thiscall
boost::unordered::detail::
table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
::reserve_for_insert
          (table<boost::unordered::detail::map<std::allocator<std::pair<const_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>_>_>,_int,_boost::tuples::tuple<bool,_unsigned_int,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_boost::hash<int>,_std::equal_to<int>_>_>
           *this,size_t size)

{
  bucket_pointer ppVar1;
  link_pointer next;
  ulong uVar2;
  size_t sVar3;
  link_pointer ppVar4;
  ulong uVar5;
  link_pointer ppVar6;
  link_pointer ppVar7;
  
  if (this->buckets_ == (bucket_pointer)0x0) {
    sVar3 = min_buckets_for_size(this,size);
    uVar2 = this->bucket_count_;
    if (this->bucket_count_ <= sVar3) {
      uVar2 = sVar3;
    }
    create_buckets(this,uVar2);
    return;
  }
  if (this->max_load_ < size) {
    uVar2 = (this->size_ >> 1) + this->size_;
    if (uVar2 <= size) {
      uVar2 = size;
    }
    sVar3 = min_buckets_for_size(this,uVar2);
    if (sVar3 != this->bucket_count_) {
      if (this->buckets_ == (bucket_pointer)0x0) {
        __assert_fail("this->buckets_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/unordered/detail/implementation.hpp"
                      ,0x1156,
                      "void boost::unordered::detail::table<boost::unordered::detail::map<std::allocator<std::pair<const int, boost::tuples::tuple<bool, unsigned int>>>, int, boost::tuples::tuple<bool, unsigned int>, boost::hash<int>, std::equal_to<int>>>::rehash_impl(std::size_t) [Types = boost::unordered::detail::map<std::allocator<std::pair<const int, boost::tuples::tuple<bool, unsigned int>>>, int, boost::tuples::tuple<bool, unsigned int>, boost::hash<int>, std::equal_to<int>>]"
                     );
      }
      create_buckets(this,sVar3);
      ppVar1 = this->buckets_;
      if (ppVar1 == (bucket_pointer)0x0) {
        __assert_fail("buckets_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/unordered/detail/implementation.hpp"
                      ,0xb8c,
                      "bucket_pointer boost::unordered::detail::table<boost::unordered::detail::map<std::allocator<std::pair<const int, boost::tuples::tuple<bool, unsigned int>>>, int, boost::tuples::tuple<bool, unsigned int>, boost::hash<int>, std::equal_to<int>>>::get_bucket(std::size_t) const [Types = boost::unordered::detail::map<std::allocator<std::pair<const int, boost::tuples::tuple<bool, unsigned int>>>, int, boost::tuples::tuple<bool, unsigned int>, boost::hash<int>, std::equal_to<int>>]"
                     );
      }
      uVar2 = this->bucket_count_;
      if (ppVar1[uVar2].next_ != (link_pointer)0x0) {
        ppVar6 = ppVar1 + uVar2;
        ppVar7 = ppVar1[uVar2].next_;
        do {
          uVar5 = (ulong)(long)*(int *)&ppVar7[2].next_ % uVar2;
          ppVar7[1].next_ = (link_pointer)(uVar5 & 0x7fffffffffffffff);
          ppVar4 = ppVar7->next_;
          if (ppVar4 == (link_pointer)0x0) {
LAB_00119dba:
            ppVar4 = (link_pointer)0x0;
          }
          else if ((long)ppVar4[1].next_ < 0) {
            do {
              ppVar7 = ppVar4;
              ppVar7[1].next_ = (link_pointer)(uVar5 | 0x8000000000000000);
              ppVar4 = ppVar7->next_;
              if (ppVar4 == (link_pointer)0x0) goto LAB_00119dba;
            } while ((long)ppVar4[1].next_ < 0);
          }
          if (ppVar1[uVar5].next_ == (link_pointer)0x0) {
            ppVar1[uVar5].next_ = ppVar6;
            ppVar4 = ppVar7->next_;
          }
          else {
            ppVar7->next_ = (ppVar1[uVar5].next_)->next_;
            (ppVar1[uVar5].next_)->next_ = ppVar6->next_;
            ppVar6->next_ = ppVar4;
            ppVar7 = ppVar6;
          }
          ppVar6 = ppVar7;
          ppVar7 = ppVar4;
        } while (ppVar4 != (link_pointer)0x0);
      }
    }
  }
  return;
}

Assistant:

inline void table<Types>::reserve_for_insert(std::size_t size)
      {
        if (!buckets_) {
          create_buckets((std::max)(bucket_count_, min_buckets_for_size(size)));
        } else if (size > max_load_) {
          std::size_t num_buckets =
            min_buckets_for_size((std::max)(size, size_ + (size_ >> 1)));

          if (num_buckets != bucket_count_)
            this->rehash_impl(num_buckets);
        }
      }